

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O3

void Fxu_MatrixComputeSingles(Fxu_Matrix *p,int fUse0,int nSingleMax)

{
  Fxu_Var **ppFVar1;
  Fxu_Var *pFVar2;
  long lVar3;
  int iVar4;
  uint *__ptr;
  void *pvVar5;
  Fxu_Var *pFVar6;
  Fxu_Var **ppFVar7;
  Fxu_Lit *pFVar8;
  int iVar9;
  uint uVar10;
  Fxu_Matrix *pVar2;
  Fxu_Matrix *__ptr_00;
  Fxu_Matrix *p_00;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  p->nWeightLimit = 1 - fUse0;
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 10000;
  __ptr[1] = 0;
  pvVar5 = malloc(80000);
  *(void **)(__ptr + 2) = pvVar5;
  pVar2 = (Fxu_Matrix *)(p->lVars).pHead;
  if (pVar2 == (Fxu_Matrix *)0x0) {
    uVar10 = 0;
  }
  else {
    ppFVar1 = &p->pOrderVars;
    uVar10 = 0;
    uVar14 = 10000;
    do {
      p->ppTailVars = ppFVar1;
      p->pOrderVars = (Fxu_Var *)0x0;
      pFVar6 = (pVar2->lVars).pHead;
      ppFVar7 = ppFVar1;
      if (pFVar6 != (Fxu_Var *)0x0) {
        do {
          for (pFVar8 = (pFVar6->lLits).pHead; pFVar8 != (Fxu_Lit *)0x0; pFVar8 = pFVar8->pHPrev) {
            pFVar2 = pFVar8->pVar;
            if (pFVar2->pOrder == (Fxu_Var *)0x0) {
              *ppFVar7 = pFVar2;
              ppFVar7 = &pFVar2->pOrder;
              p->ppTailVars = ppFVar7;
              pFVar2->pOrder = (Fxu_Var *)0x1;
            }
          }
          pFVar6 = pFVar6->pPrev;
        } while (pFVar6 != (Fxu_Var *)0x0);
        pFVar6 = *ppFVar1;
        p_00 = (Fxu_Matrix *)ppFVar1;
        if ((Fxu_Var *)0x1 < pFVar6) {
          do {
            iVar4 = Fxu_SingleCountCoincidence(p_00,pFVar6,(Fxu_Var *)pVar2);
            if (iVar4 < 1) {
              __assert_fail("Coin > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                            ,0x9d,
                            "void Fxu_MatrixComputeSinglesOneCollect(Fxu_Matrix *, Fxu_Var *, Vec_Ptr_t *)"
                           );
            }
            if (p->nWeightLimit <= iVar4 + -2) {
              uVar13 = (uint)uVar14;
              if (uVar10 == uVar13) {
                if ((int)uVar13 < 0x10) {
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar5 = malloc(0x80);
                  }
                  else {
                    pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
                  }
                  uVar14 = 0x10;
                }
                else {
                  uVar14 = (ulong)(uVar13 * 2);
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar5 = malloc(uVar14 * 8);
                  }
                  else {
                    pvVar5 = realloc(*(void **)(__ptr + 2),uVar14 * 8);
                  }
                }
                *(void **)(__ptr + 2) = pvVar5;
              }
              else {
                pvVar5 = *(void **)(__ptr + 2);
              }
              uVar13 = uVar10 + 1;
              __ptr[1] = uVar13;
              *(Fxu_Var **)((long)pvVar5 + (long)(int)uVar10 * 8) = pFVar6;
              if (uVar13 == (uint)uVar14) {
                if ((int)uVar10 < 0xf) {
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar5 = malloc(0x80);
                  }
                  else {
                    pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
                  }
                  *(void **)(__ptr + 2) = pvVar5;
                  *__ptr = 0x10;
                  uVar14 = 0x10;
                }
                else {
                  uVar12 = (uint)uVar14 * 2;
                  uVar14 = (ulong)uVar12;
                  if (*(void **)(__ptr + 2) == (void *)0x0) {
                    pvVar5 = malloc(uVar14 * 8);
                  }
                  else {
                    pvVar5 = realloc(*(void **)(__ptr + 2),uVar14 * 8);
                  }
                  *(void **)(__ptr + 2) = pvVar5;
                  *__ptr = uVar12;
                }
              }
              else {
                pvVar5 = *(void **)(__ptr + 2);
              }
              iVar9 = uVar10 + 2;
              *(Fxu_Matrix **)((long)pvVar5 + (long)(int)uVar13 * 8) = pVar2;
              if (iVar9 == (int)uVar14) {
                if ((int)uVar10 < 0xe) {
                  p_00 = *(Fxu_Matrix **)(__ptr + 2);
                  if (p_00 == (Fxu_Matrix *)0x0) {
                    p_00 = (Fxu_Matrix *)0x80;
                    pvVar5 = malloc(0x80);
                  }
                  else {
                    pvVar5 = realloc(p_00,0x80);
                  }
                  *(void **)(__ptr + 2) = pvVar5;
                  *__ptr = 0x10;
                  uVar14 = 0x10;
                }
                else {
                  uVar13 = (int)uVar14 * 2;
                  uVar14 = (ulong)uVar13;
                  __ptr_00 = *(Fxu_Matrix **)(__ptr + 2);
                  p_00 = (Fxu_Matrix *)(uVar14 * 8);
                  if (__ptr_00 == (Fxu_Matrix *)0x0) {
                    pvVar5 = malloc((size_t)p_00);
                  }
                  else {
                    pvVar5 = realloc(__ptr_00,(size_t)p_00);
                    p_00 = __ptr_00;
                  }
                  *(void **)(__ptr + 2) = pvVar5;
                  *__ptr = uVar13;
                }
              }
              else {
                pvVar5 = *(void **)(__ptr + 2);
                p_00 = pVar2;
              }
              uVar10 = uVar10 + 3;
              __ptr[1] = uVar10;
              *(long *)((long)pvVar5 + (long)iVar9 * 8) = (long)(iVar4 + -2);
            }
            pFVar6 = pFVar6->pOrder;
          } while (pFVar6 != (Fxu_Var *)0x1);
        }
      }
      Fxu_MatrixRingVarsUnmark(p);
      pVar2 = (Fxu_Matrix *)pVar2->pTable;
    } while (pVar2 != (Fxu_Matrix *)0x0);
  }
  p->nSingleTotal = (int)uVar10 / 3;
  if (nSingleMax < (int)uVar10) {
    if ((int)uVar10 % 3 != 0) {
      __assert_fail("Vec_PtrSize(vSingles) % 3 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                    ,0x3f,"void Fxu_MatrixComputeSingles(Fxu_Matrix *, int, int)");
    }
    pvVar5 = calloc(1,4000);
    if (2 < (int)uVar10) {
      lVar3 = *(long *)(__ptr + 2);
      uVar14 = 2;
      do {
        iVar4 = (int)*(undefined8 *)(lVar3 + uVar14 * 8);
        lVar11 = (long)iVar4 * 4;
        if (0x3e6 < iVar4) {
          lVar11 = 0xf9c;
        }
        *(int *)((long)pvVar5 + lVar11) = *(int *)((long)pvVar5 + lVar11) + 1;
        uVar14 = uVar14 + 3;
      } while (uVar14 < uVar10);
    }
    iVar4 = 0;
    uVar14 = 999;
    do {
      iVar9 = (int)uVar14;
      iVar4 = iVar4 + *(int *)((long)pvVar5 + uVar14 * 4);
      if (nSingleMax <= iVar4) goto LAB_00444bce;
      uVar14 = (ulong)(iVar9 - 1);
    } while (iVar9 != 0);
    iVar9 = -1;
LAB_00444bce:
    free(pvVar5);
    uVar13 = 0;
    if (2 < (int)uVar10) {
      lVar3 = *(long *)(__ptr + 2);
      uVar14 = 0;
      lVar11 = 2;
      do {
        if (iVar9 <= *(int *)(lVar3 + lVar11 * 8)) {
          uVar12 = (uint)uVar14;
          if (((int)uVar12 < 0) || (uVar10 <= uVar12)) {
LAB_00444d4f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          *(undefined8 *)(lVar3 + uVar14 * 8) = *(undefined8 *)(lVar3 + -0x10 + lVar11 * 8);
          if ((ulong)uVar10 <= lVar11 - 1U) goto LAB_00444d30;
          if (uVar10 <= uVar12 + 1) goto LAB_00444d4f;
          *(undefined8 *)(lVar3 + (ulong)(uVar12 + 1) * 8) =
               *(undefined8 *)(lVar3 + -8 + lVar11 * 8);
          if (uVar10 <= uVar12 + 2) goto LAB_00444d4f;
          uVar13 = uVar12 + 3;
          uVar14 = (ulong)uVar13;
          *(undefined8 *)(lVar3 + (ulong)(uVar12 + 2) * 8) = *(undefined8 *)(lVar3 + lVar11 * 8);
          if (uVar13 / 3 == nSingleMax) break;
        }
        uVar13 = (uint)uVar14;
        lVar11 = lVar11 + 3;
      } while ((int)lVar11 < (int)uVar10);
    }
    if ((int)uVar10 < (int)uVar13) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    p->nWeightLimit = iVar9;
    uVar10 = uVar13;
  }
  if (0x55555554 < uVar10 * -0x55555555 + 0x2aaaaaaa) {
    __assert_fail("Vec_PtrSize(vSingles) % 3 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                  ,0x66,"void Fxu_MatrixComputeSingles(Fxu_Matrix *, int, int)");
  }
  pvVar5 = *(void **)(__ptr + 2);
  if ((int)uVar10 < 1) {
    if (pvVar5 == (void *)0x0) goto LAB_00444cfe;
  }
  else {
    uVar14 = 1;
    do {
      if ((uVar10 <= uVar14) || ((ulong)uVar10 <= uVar14 + 1)) {
LAB_00444d30:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Fxu_MatrixAddSingle(p,*(Fxu_Var **)((long)pvVar5 + uVar14 * 8 + -8),
                          *(Fxu_Var **)((long)pvVar5 + uVar14 * 8),
                          *(int *)((long)pvVar5 + uVar14 * 8 + 8));
      iVar4 = (int)uVar14;
      uVar14 = uVar14 + 3;
    } while (iVar4 + 2 < (int)uVar10);
  }
  free(pvVar5);
LAB_00444cfe:
  free(__ptr);
  return;
}

Assistant:

void Fxu_MatrixComputeSingles( Fxu_Matrix * p, int fUse0, int nSingleMax )
{
    Fxu_Var * pVar;
    Vec_Ptr_t * vSingles;
    int i, k;
    // set the weight limit
    p->nWeightLimit = 1 - fUse0;
    // iterate through columns in the matrix and collect single-cube divisors
    vSingles = Vec_PtrAlloc( 10000 );
    Fxu_MatrixForEachVariable( p, pVar )
        Fxu_MatrixComputeSinglesOneCollect( p, pVar, vSingles );
    p->nSingleTotal = Vec_PtrSize(vSingles) / 3;
    // check if divisors should be filtered
    if ( Vec_PtrSize(vSingles) > nSingleMax )
    {
        int * pWeigtCounts, nDivCount, Weight, i, c;;
        assert( Vec_PtrSize(vSingles) % 3 == 0 );
        // count how many divisors have the given weight
        pWeigtCounts = ABC_ALLOC( int, 1000 );
        memset( pWeigtCounts, 0, sizeof(int) * 1000 );
        for ( i = 2; i < Vec_PtrSize(vSingles); i += 3 )
        {
            Weight = (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles, i);
            if ( Weight >= 999 )
                pWeigtCounts[999]++;
            else
                pWeigtCounts[Weight]++;
        }
        // select the bound on the weight (above this bound, singles will be included)
        nDivCount = 0;
        for ( c = 999; c >= 0; c-- )
        {
            nDivCount += pWeigtCounts[c];
            if ( nDivCount >= nSingleMax )
                break;
        }
        ABC_FREE( pWeigtCounts );
        // collect singles with the given costs
        k = 0;
        for ( i = 2; i < Vec_PtrSize(vSingles); i += 3 )
        {
            Weight = (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles, i);
            if ( Weight < c )
                continue;
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i-2) );
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i-1) );
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i) );
            if ( k/3 == nSingleMax )
                break;
        }
        Vec_PtrShrink( vSingles, k );
        // adjust the weight limit
        p->nWeightLimit = c;
    }
    // collect the selected divisors
    assert( Vec_PtrSize(vSingles) % 3 == 0 );
    for ( i = 0; i < Vec_PtrSize(vSingles); i += 3 )
    {
        Fxu_MatrixAddSingle( p, 
            (Fxu_Var *)Vec_PtrEntry(vSingles,i), 
            (Fxu_Var *)Vec_PtrEntry(vSingles,i+1), 
            (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles,i+2) );
    }
    Vec_PtrFree( vSingles );
}